

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
 __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>
::getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<4ul>>>
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>
           *this)

{
  undefined8 extraout_RDX;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>
  *in_RSI;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
  IVar1;
  undefined8 local_80;
  undefined1 local_78 [56];
  string local_40;
  
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
                    *)local_78);
  getStorageFilePath_abi_cxx11_(&local_40,in_RSI);
  std::filesystem::__cxx11::path::path((path *)(local_78 + 0x10),&local_40,auto_format);
  (**(code **)*(_func_int **)local_78._0_8_)(&local_80,local_78._0_8_,local_78 + 0x10,0);
  *(undefined8 *)this = local_80;
  this[8] = (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>
             )0x0;
  local_80 = 0;
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x10));
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  IVar1._8_8_ = extraout_RDX;
  IVar1.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )this;
  return IVar1;
}

Assistant:

io::InputIterator<Out, IndexT> getCustomDataIterator() const {
        return io::InputIterator<Out, IndexT>(getFileManager()->getInputStream(getStorageFilePath(), 0));
    }